

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void pmevcntr_op_start(CPUARMState_conflict *env,uint8_t counter)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  uint32_t new_pmevcntr;
  uint16_t event_idx;
  uint64_t count;
  uint16_t event;
  uint8_t counter_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = (env->cp15).c14_pmevtyper[counter];
  _new_pmevcntr = 0;
  _Var2 = event_supported((uint16_t)uVar1);
  if (_Var2) {
    _new_pmevcntr = (*pm_events[supported_event_map[uVar1 & 0xffff]].get_count)(env);
  }
  _Var2 = pmu_counter_enabled(env,counter);
  if (_Var2) {
    uVar3 = (int)_new_pmevcntr - (int)(env->cp15).c14_pmevcntr_delta[counter];
    if (((env->cp15).c14_pmevcntr[counter] & (ulong)(uVar3 ^ 0xffffffff) & 0xffffffff80000000) != 0)
    {
      (env->cp15).c9_pmovsr = 1L << (counter & 0x3f) | (env->cp15).c9_pmovsr;
    }
    (env->cp15).c14_pmevcntr[counter] = (ulong)uVar3;
  }
  (env->cp15).c14_pmevcntr_delta[counter] = _new_pmevcntr;
  return;
}

Assistant:

static void pmevcntr_op_start(CPUARMState *env, uint8_t counter)
{

    uint16_t event = env->cp15.c14_pmevtyper[counter] & PMXEVTYPER_EVTCOUNT;
    uint64_t count = 0;
    if (event_supported(event)) {
        uint16_t event_idx = supported_event_map[event];
        count = pm_events[event_idx].get_count(env);
    }

    if (pmu_counter_enabled(env, counter)) {
        uint32_t new_pmevcntr = count - env->cp15.c14_pmevcntr_delta[counter];

        if (env->cp15.c14_pmevcntr[counter] & ~new_pmevcntr & INT32_MIN) {
            env->cp15.c9_pmovsr |= (1ULL << counter);
        }
        env->cp15.c14_pmevcntr[counter] = new_pmevcntr;
    }
    env->cp15.c14_pmevcntr_delta[counter] = count;
}